

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_50a29::StringExpr::dump(StringExpr *this)

{
  bool bVar1;
  reference pcVar2;
  const_iterator cStack_28;
  char32_t c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<char32_t,_std::allocator<char32_t>_> *__range1;
  StringExpr *this_local;
  
  fprintf(_stderr,"\"");
  __end1 = std::vector<char32_t,_std::allocator<char32_t>_>::begin(&this->characters);
  cStack_28 = std::vector<char32_t,_std::allocator<char32_t>_>::end(&this->characters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
             ::operator*(&__end1);
    fprintf(_stderr,"%c",(ulong)(uint)(int)(char)*pcVar2);
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
    operator++(&__end1);
  }
  fprintf(_stderr,"\"");
  return;
}

Assistant:

void StringExpr::dump() const
{
	fprintf(stderr, "\"");
	for (char32_t c : characters)
	{
		fprintf(stderr, "%c", static_cast<char>(c));
	}
	fprintf(stderr, "\"");
}